

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iinq.c
# Opt level: O2

ion_err_t iinq_create_source(char *schema_file_name,ion_key_type_t key_type,ion_key_size_t key_size,
                            ion_value_size_t value_size)

{
  ion_err_t iVar1;
  int iVar2;
  FILE *pFVar3;
  size_t sVar4;
  ion_dictionary_t dictionary;
  ion_dictionary_handler_t handler;
  
  dictionary.handler = &handler;
  iVar1 = ion_init_master_table();
  if (iVar1 == '\0') {
    bpptree_init(&handler);
    pFVar3 = fopen(schema_file_name,"rb");
    if (pFVar3 == (FILE *)0x0) {
      pFVar3 = fopen(schema_file_name,"w+b");
      if (pFVar3 == (FILE *)0x0) {
        iVar1 = '\t';
      }
      else {
        iVar2 = fseek(pFVar3,0,0);
        if (iVar2 != 0) {
          return '\r';
        }
        iVar1 = ion_master_table_create_dictionary
                          (&handler,&dictionary,key_type,key_size,value_size,0xffffffff);
        if (iVar1 != '\0') {
          return iVar1;
        }
        sVar4 = fwrite(&(dictionary.instance)->id,4,1,pFVar3);
        if (sVar4 != 1) {
          return '\b';
        }
        iVar2 = fclose(pFVar3);
        if (iVar2 != 0) {
          return '\n';
        }
        ion_close_dictionary(&dictionary);
        iVar1 = '\0';
      }
      ion_close_master_table();
    }
    else {
      iVar2 = fclose(pFVar3);
      iVar1 = '\n';
      if (iVar2 == 0) {
        iVar1 = '\x11';
      }
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
iinq_create_source(
	char				*schema_file_name,
	ion_key_type_t		key_type,
	ion_key_size_t		key_size,
	ion_value_size_t	value_size
) {
	ion_err_t					error;
	FILE						*schema_file;
	ion_dictionary_t			dictionary;
	ion_dictionary_handler_t	handler;

	dictionary.handler	= &handler;

	error				= ion_init_master_table();

	if (err_ok != error) {
		return error;
	}

	/* Load the handler. */
	bpptree_init(&handler);

	/* If the file exists, fail. */
	if (NULL != (schema_file = fopen(schema_file_name, "rb"))) {
		if (0 != fclose(schema_file)) {
			return err_file_close_error;
		}

		return err_duplicate_dictionary_error;
	}
	/* Otherwise, we are creating the dictionary for the first time. */
	else if (NULL != (schema_file = fopen(schema_file_name, "w+b"))) {
		if (0 != fseek(schema_file, 0, SEEK_SET)) {
			return err_file_bad_seek;
		}

		error = ion_master_table_create_dictionary(&handler, &dictionary, key_type, key_size, value_size, -1);

		if (err_ok != error) {
			return error;
		}

		if (1 != fwrite(&dictionary.instance->id, sizeof(dictionary.instance->id), 1, schema_file)) {
			return err_file_read_error;
		}

		if (0 != fclose(schema_file)) {
			return err_file_close_error;
		}

		ion_close_dictionary(&dictionary);

		error = err_ok;
	}
	else {
		error = err_file_open_error;
	}

	ion_close_master_table();

	return error;
}